

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O2

void tcg_gen_st_vec_mips(TCGContext_conflict3 *tcg_ctx,TCGv_vec r,TCGv_ptr b,TCGArg o)

{
  vec_gen_ldst(tcg_ctx,INDEX_op_st_vec,r,b,o);
  return;
}

Assistant:

void tcg_gen_st_vec(TCGContext *tcg_ctx, TCGv_vec r, TCGv_ptr b, TCGArg o)
{
    vec_gen_ldst(tcg_ctx, INDEX_op_st_vec, r, b, o);
}